

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoli.c
# Opt level: O0

int fffi4i2(int *input,long ntodo,double scale,double zero,int nullcheck,int tnull,short nullval,
           char *nullarray,int *anynull,short *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  char *nullarray_local;
  short nullval_local;
  int tnull_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  int *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        dVar1 = (double)input[ii] * scale + zero;
        if (-32768.49 <= dVar1) {
          if (dVar1 <= 32767.49) {
            output[ii] = (short)(int)dVar1;
          }
          else {
            *status = -0xb;
            output[ii] = 0x7fff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = -0x8000;
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if (input[ii] < -0x8000) {
          *status = -0xb;
          output[ii] = -0x8000;
        }
        else if (input[ii] < 0x8000) {
          output[ii] = (short)input[ii];
        }
        else {
          *status = -0xb;
          output[ii] = 0x7fff;
        }
      }
    }
  }
  else if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      if (input[ii] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[ii] = nullval;
        }
        else {
          nullarray[ii] = '\x01';
        }
      }
      else {
        dVar1 = (double)input[ii] * scale + zero;
        if (-32768.49 <= dVar1) {
          if (dVar1 <= 32767.49) {
            output[ii] = (short)(int)dVar1;
          }
          else {
            *status = -0xb;
            output[ii] = 0x7fff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = -0x8000;
        }
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      if (input[ii] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[ii] = nullval;
        }
        else {
          nullarray[ii] = '\x01';
        }
      }
      else if (input[ii] < -0x8000) {
        *status = -0xb;
        output[ii] = -0x8000;
      }
      else if (input[ii] < 0x8000) {
        output[ii] = (short)input[ii];
      }
      else {
        *status = -0xb;
        output[ii] = 0x7fff;
      }
    }
  }
  return *status;
}

Assistant:

int fffi4i2(INT32BIT *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            INT32BIT tnull,       /* I - value of FITS TNULLn keyword if any */
            short nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            short *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < SHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MIN;
                }
                else if (input[ii] > SHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MAX;
                }
                else
                    output[ii] = (short) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DSHRT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MIN;
                }
                else if (dvalue > DSHRT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = SHRT_MAX;
                }
                else
                    output[ii] = (short) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    if (input[ii] < SHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MIN;
                    }
                    else if (input[ii] > SHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MAX;
                    }
                    else
                        output[ii] = (short) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DSHRT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MIN;
                    }
                    else if (dvalue > DSHRT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = SHRT_MAX;
                    }
                    else
                        output[ii] = (short) dvalue;
                }
            }
        }
    }
    return(*status);
}